

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cookie.c
# Opt level: O3

int mbedtls_ssl_cookie_check
              (void *p_ctx,uchar *cookie,size_t cookie_len,uchar *cli_id,size_t cli_id_len)

{
  uint uVar1;
  uchar diff;
  byte bVar2;
  int iVar3;
  time_t tVar4;
  long lVar5;
  int iVar6;
  uchar *p;
  uchar ref_hmac [28];
  undefined8 local_40;
  byte local_38 [28];
  uchar local_1c [4];
  
  local_40 = local_38;
  iVar6 = -0x7100;
  if ((cli_id != (uchar *)0x0 && p_ctx != (void *)0x0) && (iVar6 = -1, cookie_len == 0x20)) {
    iVar3 = ssl_cookie_hmac((mbedtls_md_context_t *)p_ctx,cookie,(uchar **)&local_40,local_1c,cli_id
                            ,cli_id_len);
    if (iVar3 == 0) {
      lVar5 = 4;
      bVar2 = 0;
      do {
        bVar2 = bVar2 | local_38[lVar5 + -4] ^ cookie[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x20);
      if (bVar2 == 0) {
        tVar4 = time((time_t *)0x0);
        if ((*(ulong *)((long)p_ctx + 0x18) == 0) ||
           (uVar1 = *(uint *)cookie,
           tVar4 - (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                          uVar1 << 0x18) <= *(ulong *)((long)p_ctx + 0x18))) {
          iVar6 = 0;
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int mbedtls_ssl_cookie_check( void *p_ctx,
                      const unsigned char *cookie, size_t cookie_len,
                      const unsigned char *cli_id, size_t cli_id_len )
{
    unsigned char ref_hmac[COOKIE_HMAC_LEN];
    int ret = 0;
    unsigned char *p = ref_hmac;
    mbedtls_ssl_cookie_ctx *ctx = (mbedtls_ssl_cookie_ctx *) p_ctx;
    unsigned long cur_time, cookie_time;

    if( ctx == NULL || cli_id == NULL )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    if( cookie_len != COOKIE_LEN )
        return( -1 );

#if defined(MBEDTLS_THREADING_C)
    if( ( ret = mbedtls_mutex_lock( &ctx->mutex ) ) != 0 )
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR + ret );
#endif

    if( ssl_cookie_hmac( &ctx->hmac_ctx, cookie,
                         &p, p + sizeof( ref_hmac ),
                         cli_id, cli_id_len ) != 0 )
        ret = -1;

#if defined(MBEDTLS_THREADING_C)
    if( mbedtls_mutex_unlock( &ctx->mutex ) != 0 )
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR +
                MBEDTLS_ERR_THREADING_MUTEX_ERROR );
#endif

    if( ret != 0 )
        return( ret );

    if( mbedtls_ssl_safer_memcmp( cookie + 4, ref_hmac, sizeof( ref_hmac ) ) != 0 )
        return( -1 );

#if defined(MBEDTLS_HAVE_TIME)
    cur_time = (unsigned long) mbedtls_time( NULL );
#else
    cur_time = ctx->serial;
#endif

    cookie_time = ( (unsigned long) cookie[0] << 24 ) |
                  ( (unsigned long) cookie[1] << 16 ) |
                  ( (unsigned long) cookie[2] <<  8 ) |
                  ( (unsigned long) cookie[3]       );

    if( ctx->timeout != 0 && cur_time - cookie_time > ctx->timeout )
        return( -1 );

    return( 0 );
}